

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::PushLabel
          (BinaryReaderIR *this,LabelType label_type,ExprList *first,Expr *context)

{
  size_type sVar1;
  Expr *local_30;
  Expr *context_local;
  ExprList *first_local;
  BinaryReaderIR *pBStack_18;
  LabelType label_type_local;
  BinaryReaderIR *this_local;
  
  local_30 = context;
  context_local = (Expr *)first;
  first_local._4_4_ = label_type;
  pBStack_18 = this;
  sVar1 = std::
          vector<wabt::(anonymous_namespace)::LabelNode,_std::allocator<wabt::(anonymous_namespace)::LabelNode>_>
          ::size(&this->label_stack_);
  if (sVar1 < 0x4000) {
    std::
    vector<wabt::(anonymous_namespace)::LabelNode,std::allocator<wabt::(anonymous_namespace)::LabelNode>>
    ::emplace_back<wabt::LabelType&,wabt::intrusive_list<wabt::Expr>*&,wabt::Expr*&>
              ((vector<wabt::(anonymous_namespace)::LabelNode,std::allocator<wabt::(anonymous_namespace)::LabelNode>>
                *)&this->label_stack_,(LabelType *)((long)&first_local + 4),
               (intrusive_list<wabt::Expr> **)&context_local,&local_30);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    PrintError(this,"label stack exceeds max nesting depth");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderIR::PushLabel(LabelType label_type,
                                 ExprList* first,
                                 Expr* context) {
  if (label_stack_.size() >= kMaxNestingDepth) {
    PrintError("label stack exceeds max nesting depth");
    return Result::Error;
  }
  label_stack_.emplace_back(label_type, first, context);
  return Result::Ok;
}